

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O1

void __thiscall
Js::SourceDynamicProfileManager::EnsureStartupFunctions
          (SourceDynamicProfileManager *this,uint numberOfFunctions)

{
  Type *addr;
  BVFixed *pBVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  BVFixed *pBVar6;
  
  if (numberOfFunctions == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x45,"(numberOfFunctions != 0)","numberOfFunctions != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pBVar1 = (this->startupFunctions).ptr;
  if ((pBVar1 != (BVFixed *)0x0) && (BVar4 = BVFixed::Length(pBVar1), numberOfFunctions <= BVar4)) {
    return;
  }
  addr = &this->startupFunctions;
  pBVar1 = (this->startupFunctions).ptr;
  pBVar6 = BVFixed::New<Memory::Recycler>(numberOfFunctions,this->recycler,false);
  Memory::Recycler::WBSetBit((char *)addr);
  (this->startupFunctions).ptr = pBVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if (pBVar1 == (BVFixed *)0x0) {
    return;
  }
  BVFixed::Copy(addr->ptr,pBVar1);
  return;
}

Assistant:

void SourceDynamicProfileManager::EnsureStartupFunctions(uint numberOfFunctions)
    {
        Assert(numberOfFunctions != 0);
        if(!startupFunctions || numberOfFunctions > startupFunctions->Length())
        {
            BVFixed* oldStartupFunctions = this->startupFunctions;
            startupFunctions = BVFixed::New(numberOfFunctions, this->GetRecycler());
            if(oldStartupFunctions)
            {
                this->startupFunctions->Copy(oldStartupFunctions);
            }
        }
    }